

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftUCbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  int iVar11;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_c8;
  cpp_dec_float<100U,_int,_void> local_78;
  
  pcVar12 = &(this->theCoUbound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 0x10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems[6] = 0;
  local_78.data._M_elems[7] = 0;
  local_78.data._M_elems[8] = 0;
  local_78.data._M_elems[9] = 0;
  local_78.data._M_elems[10] = 0;
  local_78.data._M_elems[0xb] = 0;
  local_78.data._M_elems[0xc] = 0;
  local_78.data._M_elems[0xd] = 0;
  local_78.data._M_elems._56_5_ = 0;
  local_78.data._M_elems[0xf]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  if (&local_78 == pcVar12) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&local_78,&to->m_backend);
    if (local_78.data._M_elems[0] != 0 || local_78.fpclass != cpp_dec_float_finite) {
      local_78.neg = (bool)(local_78.neg ^ 1);
    }
  }
  else {
    if (&local_78 != &to->m_backend) {
      local_78.data._M_elems._0_8_ = *(undefined8 *)(to->m_backend).data._M_elems;
      local_78.data._M_elems._8_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 2);
      local_78.data._M_elems._16_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 4);
      local_78.data._M_elems._24_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 6);
      local_78.data._M_elems._32_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 8);
      local_78.data._M_elems._40_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 10);
      local_78.data._M_elems._48_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 0xc);
      uVar3 = *(undefined8 *)((to->m_backend).data._M_elems + 0xe);
      local_78.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_78.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_78.exp = (to->m_backend).exp;
      local_78.neg = (to->m_backend).neg;
      local_78.fpclass = (to->m_backend).fpclass;
      local_78.prec_elem = (to->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_78,pcVar12);
  }
  if (local_78.fpclass != cpp_dec_float_NaN) {
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 0x10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems[6] = 0;
    local_c8.data._M_elems[7] = 0;
    local_c8.data._M_elems[8] = 0;
    local_c8.data._M_elems[9] = 0;
    local_c8.data._M_elems[10] = 0;
    local_c8.data._M_elems[0xb] = 0;
    local_c8.data._M_elems[0xc] = 0;
    local_c8.data._M_elems[0xd] = 0;
    local_c8.data._M_elems._56_5_ = 0;
    local_c8.data._M_elems[0xf]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_c8,0.0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_78,&local_c8);
    if (0 < iVar11) {
      pcVar12 = &(this->theCoUbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
      local_c8.fpclass = cpp_dec_float_finite;
      local_c8.prec_elem = 0x10;
      local_c8.data._M_elems[0] = 0;
      local_c8.data._M_elems[1] = 0;
      local_c8.data._M_elems[2] = 0;
      local_c8.data._M_elems[3] = 0;
      local_c8.data._M_elems[4] = 0;
      local_c8.data._M_elems[5] = 0;
      local_c8.data._M_elems[6] = 0;
      local_c8.data._M_elems[7] = 0;
      local_c8.data._M_elems[8] = 0;
      local_c8.data._M_elems[9] = 0;
      local_c8.data._M_elems[10] = 0;
      local_c8.data._M_elems[0xb] = 0;
      local_c8.data._M_elems[0xc] = 0;
      local_c8.data._M_elems[0xd] = 0;
      local_c8.data._M_elems._56_5_ = 0;
      local_c8.data._M_elems[0xf]._1_3_ = 0;
      local_c8.exp = 0;
      local_c8.neg = false;
      if (&local_c8 == pcVar12) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_c8,&to->m_backend);
        if (local_c8.data._M_elems[0] != 0 || local_c8.fpclass != cpp_dec_float_finite) {
          local_c8.neg = (bool)(local_c8.neg ^ 1);
        }
      }
      else {
        if (&local_c8 != &to->m_backend) {
          local_c8.data._M_elems._0_8_ = *(undefined8 *)(to->m_backend).data._M_elems;
          local_c8.data._M_elems._8_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 2);
          local_c8.data._M_elems._16_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 4);
          local_c8.data._M_elems._24_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 6);
          local_c8.data._M_elems._32_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 8);
          local_c8.data._M_elems._40_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 10);
          local_c8.data._M_elems._48_8_ = *(undefined8 *)((to->m_backend).data._M_elems + 0xc);
          uVar3 = *(undefined8 *)((to->m_backend).data._M_elems + 0xe);
          local_c8.data._M_elems._56_5_ = SUB85(uVar3,0);
          local_c8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_c8.exp = (to->m_backend).exp;
          local_c8.neg = (to->m_backend).neg;
          local_c8.fpclass = (to->m_backend).fpclass;
          local_c8.prec_elem = (to->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_c8,pcVar12);
      }
      goto LAB_003d4a03;
    }
  }
  local_c8.fpclass = cpp_dec_float_finite;
  local_c8.prec_elem = 0x10;
  local_c8.data._M_elems[0] = 0;
  local_c8.data._M_elems[1] = 0;
  local_c8.data._M_elems[2] = 0;
  local_c8.data._M_elems[3] = 0;
  local_c8.data._M_elems[4] = 0;
  local_c8.data._M_elems[5] = 0;
  local_c8.data._M_elems[6] = 0;
  local_c8.data._M_elems[7] = 0;
  local_c8.data._M_elems[8] = 0;
  local_c8.data._M_elems[9] = 0;
  local_c8.data._M_elems[10] = 0;
  local_c8.data._M_elems[0xb] = 0;
  local_c8.data._M_elems[0xc] = 0;
  local_c8.data._M_elems[0xd] = 0;
  local_c8.data._M_elems._56_5_ = 0;
  local_c8.data._M_elems[0xf]._1_3_ = 0;
  local_c8.exp = 0;
  local_c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_c8,0.0);
LAB_003d4a03:
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&local_c8);
  pnVar2 = (this->theCoUbound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)(to->m_backend).data._M_elems;
  uVar4 = *(undefined8 *)((to->m_backend).data._M_elems + 2);
  uVar5 = *(undefined8 *)((to->m_backend).data._M_elems + 4);
  uVar6 = *(undefined8 *)((to->m_backend).data._M_elems + 6);
  uVar7 = *(undefined8 *)((to->m_backend).data._M_elems + 8);
  uVar8 = *(undefined8 *)((to->m_backend).data._M_elems + 10);
  uVar9 = *(undefined8 *)((to->m_backend).data._M_elems + 0xe);
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x30);
  *(undefined8 *)puVar1 = *(undefined8 *)((to->m_backend).data._M_elems + 0xc);
  *(undefined8 *)(puVar1 + 2) = uVar9;
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar7;
  *(undefined8 *)(puVar1 + 2) = uVar8;
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar5;
  *(undefined8 *)(puVar1 + 2) = uVar6;
  *(undefined8 *)&pnVar2[i].m_backend.data = uVar3;
  *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8) = uVar4;
  pnVar2[i].m_backend.exp = (to->m_backend).exp;
  pnVar2[i].m_backend.neg = (to->m_backend).neg;
  iVar10 = (to->m_backend).prec_elem;
  pnVar2[i].m_backend.fpclass = (to->m_backend).fpclass;
  pnVar2[i].m_backend.prec_elem = iVar10;
  return;
}

Assistant:

void shiftUCbound(int i, R to)
   {
      assert(theType == LEAVE);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX(to - (*theCoUbound)[i], 0.0);
      (*theCoUbound)[i] = to;
   }